

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  bool bVar7;
  uint *local_28;
  int *pLink;
  int Type;
  int iFanin;
  int k;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  iVar1 = Wln_ObjType(p->pNtk,iObj);
  pcVar5 = Abc_OperName(iVar1);
  uVar2 = Wln_ObjNameId(p->pNtk,iObj);
  uVar3 = Wln_ObjInstId(p->pNtk,iObj);
  uVar4 = Wln_ObjFaninNum(p->pNtk,iObj);
  printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",(ulong)(uint)iObj,pcVar5
         ,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  Type = 0;
  while( true ) {
    iVar1 = Wln_ObjFaninNum(p->pNtk,iObj);
    bVar7 = false;
    if (Type < iVar1) {
      piVar6 = Wln_RetFanins(p,iObj);
      pLink._4_4_ = piVar6[Type << 1];
      piVar6 = Wln_RetFanins(p,iObj);
      local_28 = (uint *)(piVar6 + (long)(Type << 1) + 1);
      bVar7 = local_28 != (uint *)0x0;
    }
    if (!bVar7) break;
    if ((pLink._4_4_ != 0) &&
       (((iVar1 = Wln_ObjFaninNum(p->pNtk,pLink._4_4_), iVar1 != 0 ||
         (iVar1 = Wln_ObjIsCi(p->pNtk,pLink._4_4_), iVar1 != 0)) &&
        (printf("%5d ",(ulong)pLink._4_4_), *local_28 != 0)))) {
      uVar2 = *local_28;
      uVar3 = Vec_IntEntry(&p->vEdgeLinks,*local_28);
      uVar4 = Vec_IntEntry(&p->vEdgeLinks,*local_28 + 1);
      printf("(%d : %d %d) ",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
    }
    Type = Type + 1;
  }
  printf("\n");
  return;
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}